

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags.cc
# Opt level: O0

void __thiscall
gflags::anon_unknown_2::FlagRegistry::RegisterFlag(FlagRegistry *this,CommandLineFlag *flag)

{
  undefined8 uVar1;
  int iVar2;
  pointer ppVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  mapped_type *ppCVar7;
  __enable_if_t<is_constructible<value_type,_pair<const_char_*,_CommandLineFlag_*>_>::value,_pair<iterator,_bool>_>
  _Var8;
  char *local_40;
  pair<const_char_*,_gflags::(anonymous_namespace)::CommandLineFlag_*> local_38;
  _Rb_tree_iterator<std::pair<const_char_*const,_gflags::(anonymous_namespace)::CommandLineFlag_*>_>
  local_28;
  pair<std::_Rb_tree_iterator<std::pair<const_char_*const,_gflags::(anonymous_namespace)::CommandLineFlag_*>_>,_bool>
  ins;
  CommandLineFlag *flag_local;
  FlagRegistry *this_local;
  
  ins._8_8_ = flag;
  Lock(this);
  local_40 = CommandLineFlag::name((CommandLineFlag *)ins._8_8_);
  std::pair<const_char_*,_gflags::(anonymous_namespace)::CommandLineFlag_*>::
  pair<const_char_*,_gflags::(anonymous_namespace)::CommandLineFlag_*&,_true>
            (&local_38,&local_40,(CommandLineFlag **)&ins.second);
  _Var8 = std::
          map<char_const*,gflags::(anonymous_namespace)::CommandLineFlag*,gflags::(anonymous_namespace)::StringCmp,std::allocator<std::pair<char_const*const,gflags::(anonymous_namespace)::CommandLineFlag*>>>
          ::insert<std::pair<char_const*,gflags::(anonymous_namespace)::CommandLineFlag*>>
                    ((map<char_const*,gflags::(anonymous_namespace)::CommandLineFlag*,gflags::(anonymous_namespace)::StringCmp,std::allocator<std::pair<char_const*const,gflags::(anonymous_namespace)::CommandLineFlag*>>>
                      *)this,&local_38);
  local_28 = _Var8.first._M_node;
  ins.first._M_node._0_1_ = _Var8.second;
  if (((undefined1  [16])_Var8 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    ppVar3 = std::
             _Rb_tree_iterator<std::pair<const_char_*const,_gflags::(anonymous_namespace)::CommandLineFlag_*>_>
             ::operator->(&local_28);
    pcVar4 = CommandLineFlag::filename(ppVar3->second);
    pcVar5 = CommandLineFlag::filename((CommandLineFlag *)ins._8_8_);
    iVar2 = strcmp(pcVar4,pcVar5);
    if (iVar2 == 0) {
      pcVar4 = CommandLineFlag::name((CommandLineFlag *)ins._8_8_);
      pcVar5 = CommandLineFlag::filename((CommandLineFlag *)ins._8_8_);
      pcVar6 = CommandLineFlag::filename((CommandLineFlag *)ins._8_8_);
      ReportError(DIE,
                  "ERROR: something wrong with flag \'%s\' in file \'%s\'.  One possibility: file \'%s\' is being linked both statically and dynamically into this executable.\n"
                  ,pcVar4,pcVar5,pcVar6);
    }
    else {
      pcVar4 = CommandLineFlag::name((CommandLineFlag *)ins._8_8_);
      ppVar3 = std::
               _Rb_tree_iterator<std::pair<const_char_*const,_gflags::(anonymous_namespace)::CommandLineFlag_*>_>
               ::operator->(&local_28);
      pcVar5 = CommandLineFlag::filename(ppVar3->second);
      pcVar6 = CommandLineFlag::filename((CommandLineFlag *)ins._8_8_);
      ReportError(DIE,
                  "ERROR: flag \'%s\' was defined more than once (in files \'%s\' and \'%s\').\n",
                  pcVar4,pcVar5,pcVar6);
    }
  }
  uVar1 = ins._8_8_;
  ppCVar7 = std::
            map<const_void_*,_gflags::(anonymous_namespace)::CommandLineFlag_*,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_gflags::(anonymous_namespace)::CommandLineFlag_*>_>_>
            ::operator[](&this->flags_by_ptr_,*(key_type **)(ins._8_8_ + 0x28));
  *ppCVar7 = (mapped_type)uVar1;
  Unlock(this);
  return;
}

Assistant:

void FlagRegistry::RegisterFlag(CommandLineFlag* flag) {
  Lock();
  pair<FlagIterator, bool> ins =
    flags_.insert(pair<const char*, CommandLineFlag*>(flag->name(), flag));
  if (ins.second == false) {   // means the name was already in the map
    if (strcmp(ins.first->second->filename(), flag->filename()) != 0) {
      ReportError(DIE, "ERROR: flag '%s' was defined more than once "
                  "(in files '%s' and '%s').\n",
                  flag->name(),
                  ins.first->second->filename(),
                  flag->filename());
    } else {
      ReportError(DIE, "ERROR: something wrong with flag '%s' in file '%s'.  "
                  "One possibility: file '%s' is being linked both statically "
                  "and dynamically into this executable.\n",
                  flag->name(),
                  flag->filename(), flag->filename());
    }
  }
  // Also add to the flags_by_ptr_ map.
  flags_by_ptr_[flag->current_->value_buffer_] = flag;
  Unlock();
}